

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGSpatialSort.cpp
# Opt level: O2

void __thiscall
Assimp::SGSpatialSort::Add(SGSpatialSort *this,aiVector3D *vPosition,uint index,uint smoothingGroup)

{
  Entry local_38;
  
  local_38.mDistance = ::operator*(vPosition,&this->mPlaneNormal);
  local_38.mPosition.x = vPosition->x;
  local_38.mPosition.y = vPosition->y;
  local_38.mPosition.z = vPosition->z;
  local_38.mIndex = index;
  local_38.mSmoothGroups = smoothingGroup;
  std::vector<Assimp::SGSpatialSort::Entry,_std::allocator<Assimp::SGSpatialSort::Entry>_>::
  emplace_back<Assimp::SGSpatialSort::Entry>(&this->mPositions,&local_38);
  return;
}

Assistant:

void SGSpatialSort::Add(const aiVector3D& vPosition, unsigned int index,
    unsigned int smoothingGroup)
{
    // store position by index and distance
    float distance = vPosition * mPlaneNormal;
    mPositions.push_back( Entry( index, vPosition,
        distance, smoothingGroup));
}